

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void initCompiler(Compiler *compiler,FunctionType type)

{
  int iVar1;
  Compiler *pCVar2;
  ObjFunction *pOVar3;
  ObjString *pOVar4;
  char *pcVar5;
  
  compiler->enclosing = current;
  compiler->function = (ObjFunction *)0x0;
  compiler->type = type;
  compiler->localCount = 0;
  compiler->scopeDepth = 0;
  pOVar3 = newFunction();
  compiler->function = pOVar3;
  current = compiler;
  if (type != TYPE_SCRIPT) {
    pOVar4 = copyString(parser.previous.start,parser.previous.length);
    current->function->name = pOVar4;
  }
  pCVar2 = current;
  iVar1 = current->localCount;
  current->localCount = iVar1 + 1;
  pCVar2->locals[iVar1].depth = 0;
  pCVar2->locals[iVar1].isCaptured = false;
  pcVar5 = "this";
  if (type == TYPE_FUNCTION) {
    pcVar5 = "";
  }
  pCVar2->locals[iVar1].name.start = pcVar5;
  pCVar2->locals[iVar1].name.length = (uint)(type != TYPE_FUNCTION) << 2;
  return;
}

Assistant:

static void initCompiler(Compiler *compiler, FunctionType type) {
    compiler->enclosing = current;
    compiler->function = NULL;
    compiler->type = type;
    compiler->localCount = 0;
    compiler->scopeDepth = 0;
    compiler->function = newFunction();
    current = compiler;

    if (type != TYPE_SCRIPT) {
        current->function->name = copyString(parser.previous.start, parser.previous.length);
    }

    Local *local = &current->locals[current->localCount++];
    local->depth = 0;
    local->isCaptured = false;
    if (type != TYPE_FUNCTION) {
        local->name.start = "this";
        local->name.length = 4;
    } else {
        local->name.start = "";
        local->name.length = 0;
    }
}